

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9HashmapLookup(jx9_hashmap *pMap,jx9_value *pKey,jx9_hashmap_node **ppNode)

{
  sxi32 rc;
  jx9_hashmap_node **ppNode_local;
  jx9_value *pKey_local;
  jx9_hashmap *pMap_local;
  
  if (pMap->nEntry == 0) {
    pMap_local._4_4_ = -6;
  }
  else {
    pMap_local._4_4_ = HashmapLookup(pMap,pKey,ppNode);
  }
  return pMap_local._4_4_;
}

Assistant:

JX9_PRIVATE sxi32 jx9HashmapLookup(
	jx9_hashmap *pMap,        /* Target hashmap */
	jx9_value *pKey,          /* Lookup key */
	jx9_hashmap_node **ppNode /* OUT: Target node on success */
	)
{
	sxi32 rc;
	if( pMap->nEntry < 1 ){
		/* TICKET 1433-25: Don't bother hashing, the hashmap is empty anyway.
		 */
		return SXERR_NOTFOUND;
	}
	rc = HashmapLookup(&(*pMap), &(*pKey), ppNode);
	return rc;
}